

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti1_io.c
# Opt level: O2

int print_hex_vals(char *data,int nbytes,FILE *fp)

{
  uint uVar1;
  undefined8 in_RAX;
  ulong uVar2;
  
  uVar1 = (uint)CONCAT71((int7)((ulong)in_RAX >> 8),data == (char *)0x0);
  if (fp != (FILE *)0x0 && data != (char *)0x0) {
    fputs("0x",(FILE *)fp);
    uVar1 = 0;
    if (nbytes < 1) {
      nbytes = uVar1;
    }
    for (uVar2 = 0; (uint)nbytes != uVar2; uVar2 = uVar2 + 1) {
      uVar1 = fprintf((FILE *)fp," %x",(ulong)(uint)(int)data[uVar2]);
    }
  }
  return uVar1;
}

Assistant:

static int print_hex_vals( const char * data, int nbytes, FILE * fp )
{
   int c;

   if ( !data || nbytes < 1 || !fp ) return -1;

   fputs("0x", fp);
   for ( c = 0; c < nbytes; c++ )
      fprintf(fp, " %x", data[c]);

   return 0;
}